

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockExpectedCall_hasOutputParameter_Test::testBody
          (TEST_MockExpectedCall_hasOutputParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  uint uVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  int value;
  SimpleString local_80;
  MockNamedValue foo;
  
  value = 1;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString((SimpleString *)&foo,"foo");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[6])(pMVar1,&foo,&value,4);
  SimpleString::~SimpleString((SimpleString *)&foo);
  SimpleString::SimpleString(&local_80,"foo");
  MockNamedValue::MockNamedValue(&foo,&local_80);
  SimpleString::~SimpleString(&local_80);
  MockNamedValue::setValue(&foo,&value);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2d])(pMVar1,&foo);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar2 & 0xff),"CHECK","call->hasOutputParameter(foo)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x2d0,pTVar4);
  MockNamedValue::~MockNamedValue(&foo);
  return;
}

Assistant:

TEST(MockExpectedCall, hasOutputParameter)
{
    const int value = 1;
    call->withOutputParameterReturning("foo", &value, sizeof(value));
    MockNamedValue foo("foo");
    foo.setValue(&value);
    CHECK(call->hasOutputParameter(foo));
}